

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.h
# Opt level: O0

void __thiscall JPG::~JPG(JPG *this)

{
  JPG *this_local;
  
  if (this->data != (MCU *)0x0) {
    operator_delete__(this->data);
  }
  if (this->blocks != (Block *)0x0) {
    operator_delete__(this->blocks);
  }
  if (this->BMPData != (YCbCr *)0x0) {
    operator_delete__(this->BMPData);
  }
  return;
}

Assistant:

~JPG() {
        delete[] data;
        delete[] blocks;
        delete[] BMPData;
    }